

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

uint64_t read_uleb128(dwarf_buf *buf)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  byte unaff_R13B;
  uint uVar5;
  char local_108 [8];
  char b [200];
  
  b[0xc0] = '\0';
  b[0xc1] = '\0';
  b[0xc2] = '\0';
  b[0xc3] = '\0';
  b[0xc4] = '\0';
  b[0xc5] = '\0';
  b[0xc6] = '\0';
  b[199] = '\0';
  uVar5 = 0;
  bVar2 = false;
  while( true ) {
    pbVar1 = buf->buf;
    iVar3 = advance(buf,1);
    if (iVar3 != 0) {
      unaff_R13B = *pbVar1;
      if (uVar5 < 0x40) {
        b._192_8_ = b._192_8_ | (ulong)(unaff_R13B & 0x7f) << ((byte)uVar5 & 0x3f);
      }
      else {
        if (!bVar2) {
          snprintf(local_108,200,"%s in %s at %d","LEB128 overflows uint64_t",buf->name,
                   (ulong)(uint)(*(int *)&buf->buf - *(int *)&buf->start));
          (*buf->error_callback)(buf->data,local_108,0);
        }
        bVar2 = true;
      }
      uVar5 = uVar5 + 7;
    }
    if (iVar3 == 0) break;
    if (-1 < (char)unaff_R13B) {
      uVar4._0_1_ = b[0xc0];
      uVar4._1_1_ = b[0xc1];
      uVar4._2_1_ = b[0xc2];
      uVar4._3_1_ = b[0xc3];
      uVar4._4_1_ = b[0xc4];
      uVar4._5_1_ = b[0xc5];
      uVar4._6_1_ = b[0xc6];
      uVar4._7_1_ = b[199];
      return uVar4;
    }
  }
  return 0;
}

Assistant:

static uint64_t
read_uleb128 (struct dwarf_buf *buf)
{
  uint64_t ret;
  unsigned int shift;
  int overflow;
  unsigned char b;

  ret = 0;
  shift = 0;
  overflow = 0;
  do
    {
      const unsigned char *p;

      p = buf->buf;
      if (!advance (buf, 1))
	return 0;
      b = *p;
      if (shift < 64)
	ret |= ((uint64_t) (b & 0x7f)) << shift;
      else if (!overflow)
	{
	  dwarf_buf_error (buf, "LEB128 overflows uint64_t", 0);
	  overflow = 1;
	}
      shift += 7;
    }
  while ((b & 0x80) != 0);

  return ret;
}